

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  ulong uVar1;
  char cVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  byte bVar7;
  _Bool _Var8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  char *__s;
  char *pcVar12;
  size_t sVar13;
  Cookie *pCVar14;
  char *pcVar15;
  long *__base;
  long *plVar16;
  Cookie *pCVar17;
  Cookie *pCVar18;
  ulong __nmemb;
  bool bVar19;
  char *local_48;
  Curl_easy *local_40;
  char *local_38;
  
  local_38 = path;
  sVar10 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar10] != (Cookie *)0x0)) {
    pCVar18 = (Cookie *)(c->cookies + sVar10);
    local_40 = data;
    remove_expired(c);
    _Var6 = Curl_host_is_ipnum(host);
    pCVar17 = (Cookie *)0x0;
    __nmemb = 0;
LAB_0011dc5f:
    do {
      do {
        pCVar18 = pCVar18->next;
        if (pCVar18 == (Cookie *)0x0) {
          if (__nmemb == 0) {
            return pCVar17;
          }
          goto LAB_0011deef;
        }
      } while ((byte)(pCVar18->secure ^ 1U | secure) != 1);
      pcVar15 = pCVar18->domain;
      if (pcVar15 != (char *)0x0) {
        bVar7 = pCVar18->tailmatch ^ 1;
        if ((bVar7 & 1) == 0 && !_Var6) {
          sVar11 = strlen(pcVar15);
          _Var8 = cookie_tailmatch(pcVar15,sVar11,host);
          if (_Var8) goto LAB_0011dcc8;
          bVar7 = pCVar18->tailmatch ^ 1;
        }
        if (((bVar7 & 1) == 0 && !_Var6) ||
           (iVar9 = curl_strequal(host,pCVar18->domain), iVar9 == 0)) goto LAB_0011dc5f;
      }
LAB_0011dcc8:
      pcVar15 = pCVar18->spath;
      if ((pcVar15 != (char *)0x0) && (sVar11 = strlen(pcVar15), sVar11 != 1)) {
        __s = (*Curl_cstrdup)(local_38);
        local_48 = __s;
        if (__s == (char *)0x0) goto LAB_0011dc5f;
        pcVar12 = strchr(__s,0x3f);
        if (pcVar12 != (char *)0x0) {
          *pcVar12 = '\0';
        }
        if ((*__s != '/') && (strstore(&local_48,"/",1), __s = local_48, local_48 == (char *)0x0))
        goto LAB_0011dc5f;
        sVar13 = strlen(__s);
        if ((sVar13 < sVar11) || (iVar9 = strncmp(pcVar15,__s,sVar11), iVar9 != 0)) {
          (*Curl_cfree)(__s);
          goto LAB_0011dc5f;
        }
        if (sVar11 == sVar13) {
          (*Curl_cfree)(__s);
        }
        else {
          cVar2 = __s[sVar11];
          (*Curl_cfree)(__s);
          if (cVar2 != '/') goto LAB_0011dc5f;
        }
      }
      pCVar14 = (Cookie *)(*Curl_ccalloc)(1,0x48);
      if (pCVar14 == (Cookie *)0x0) goto LAB_0011df74;
      if (pCVar18->domain != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pCVar18->domain);
        pCVar14->domain = pcVar15;
        if (pcVar15 != (char *)0x0) goto LAB_0011ddef;
LAB_0011df67:
        freecookie(pCVar14);
        goto LAB_0011df74;
      }
LAB_0011ddef:
      if (pCVar18->path != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pCVar18->path);
        pCVar14->path = pcVar15;
        if (pcVar15 == (char *)0x0) goto LAB_0011df67;
      }
      if (pCVar18->spath != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pCVar18->spath);
        pCVar14->spath = pcVar15;
        if (pcVar15 == (char *)0x0) goto LAB_0011df67;
      }
      if (pCVar18->name != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pCVar18->name);
        pCVar14->name = pcVar15;
        if (pcVar15 == (char *)0x0) goto LAB_0011df67;
      }
      if (pCVar18->value != (char *)0x0) {
        pcVar15 = (*Curl_cstrdup)(pCVar18->value);
        pCVar14->value = pcVar15;
        if (pcVar15 == (char *)0x0) goto LAB_0011df67;
      }
      pCVar14->expires = pCVar18->expires;
      _Var8 = pCVar18->secure;
      _Var4 = pCVar18->livecookie;
      _Var5 = pCVar18->httponly;
      pCVar14->tailmatch = pCVar18->tailmatch;
      pCVar14->secure = _Var8;
      pCVar14->livecookie = _Var4;
      pCVar14->httponly = _Var5;
      pCVar14->creationtime = pCVar18->creationtime;
      pCVar14->next = pCVar17;
      uVar1 = __nmemb + 1;
      bVar19 = __nmemb < 0x95;
      pCVar17 = pCVar14;
      __nmemb = uVar1;
    } while (bVar19);
    if (((local_40 != (Curl_easy *)0x0) && (((local_40->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar3 = (local_40->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
       )) {
      Curl_infof(local_40,"Included max number of cookies (%zu) in request!",uVar1);
    }
LAB_0011deef:
    __base = (long *)(*Curl_cmalloc)(__nmemb * 8);
    plVar16 = __base;
    if (__base != (long *)0x0) {
      for (; pCVar17 != (Cookie *)0x0; pCVar17 = pCVar17->next) {
        *plVar16 = (long)pCVar17;
        plVar16 = plVar16 + 1;
      }
      qsort(__base,__nmemb,8,cookie_sort);
      pCVar18 = (Cookie *)*__base;
      pCVar17 = pCVar18;
      for (sVar11 = 1; __nmemb != sVar11; sVar11 = sVar11 + 1) {
        pCVar14 = (Cookie *)__base[sVar11];
        pCVar17->next = pCVar14;
        pCVar17 = pCVar14;
      }
      *(undefined8 *)__base[__nmemb - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar18;
    }
LAB_0011df74:
    Curl_cookie_freelist(pCVar17);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we are secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}